

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsResetSpindashRev(uint arg_count,long *arg_array)

{
  if (target_driver < 3) {
    PrintError("Error: smpsResetSpindashRev is not supported in Sonic 1 or Sonic 2\'s driver\n");
  }
  MemoryStream_WriteByte(output_stream,0xff);
  MemoryStream_WriteByte(output_stream,'\a');
  return;
}

Assistant:

static void Macro_smpsResetSpindashRev(unsigned int arg_count, long arg_array[])
{
	(void)arg_count;
	(void)arg_array;

	if (target_driver < 3)
		PrintError("Error: smpsResetSpindashRev is not supported in Sonic 1 or Sonic 2's driver\n");

	WriteByte(0xFF);
	WriteByte(0x07);
}